

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O0

int xmlInitMemory(void)

{
  char *pcVar1;
  char *breakpoint;
  
  if (xmlMemInitialized == 0) {
    xmlMemInitialized = 1;
    xmlMemMutex = xmlNewMutex();
    pcVar1 = getenv("XML_MEM_BREAKPOINT");
    if (pcVar1 != (char *)0x0) {
      __isoc99_sscanf(pcVar1,"%ud",&xmlMemStopAtBlock);
    }
    pcVar1 = getenv("XML_MEM_TRACE");
    if (pcVar1 != (char *)0x0) {
      __isoc99_sscanf(pcVar1,"%p",&xmlMemTraceBlockAt);
    }
    breakpoint._4_4_ = 0;
  }
  else {
    breakpoint._4_4_ = -1;
  }
  return breakpoint._4_4_;
}

Assistant:

int
xmlInitMemory(void)
{
#ifdef HAVE_STDLIB_H
     char *breakpoint;
#endif
#ifdef DEBUG_MEMORY
     xmlGenericError(xmlGenericErrorContext,
	     "xmlInitMemory()\n");
#endif
    /*
     This is really not good code (see Bug 130419).  Suggestions for
     improvement will be welcome!
    */
     if (xmlMemInitialized) return(-1);
     xmlMemInitialized = 1;
     xmlMemMutex = xmlNewMutex();

#ifdef HAVE_STDLIB_H
     breakpoint = getenv("XML_MEM_BREAKPOINT");
     if (breakpoint != NULL) {
         sscanf(breakpoint, "%ud", &xmlMemStopAtBlock);
     }
#endif
#ifdef HAVE_STDLIB_H
     breakpoint = getenv("XML_MEM_TRACE");
     if (breakpoint != NULL) {
         sscanf(breakpoint, "%p", &xmlMemTraceBlockAt);
     }
#endif

#ifdef DEBUG_MEMORY
     xmlGenericError(xmlGenericErrorContext,
	     "xmlInitMemory() Ok\n");
#endif
     return(0);
}